

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O1

void after_read(uv_stream_t *handle,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  void *pvVar2;
  long *__ptr;
  int64_t eval_b;
  int64_t eval_a;
  long local_10;
  
  if (buf->base != (char *)0x0) {
    free(buf->base);
  }
  pvVar2 = malloc(0x58);
  iVar1 = uv_shutdown(pvVar2,handle,after_shutdown);
  local_10 = (long)iVar1;
  if (local_10 == 0) {
    return;
  }
  __ptr = &local_10;
  after_read_cold_1();
  uv_close(__ptr[9],on_close);
  free(__ptr);
  return;
}

Assistant:

static void after_read(uv_stream_t* handle,
                       ssize_t nread,
                       const uv_buf_t* buf) {
  uv_shutdown_t* req;
  int r;

  if (buf->base) {
    free(buf->base);
  }

  req = (uv_shutdown_t*) malloc(sizeof *req);
  r = uv_shutdown(req, handle, after_shutdown);
  ASSERT_OK(r);
}